

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O0

boolean is_home_elemental(d_level *dlev,permonst *ptr)

{
  int iVar1;
  permonst *ptr_local;
  d_level *dlev_local;
  
  if (ptr->mlet == '\x1f') {
    iVar1 = monsndx(ptr);
    switch(iVar1) {
    case 0x9f:
      dlev_local._7_1_ = on_level(dlev,&dungeon_topology.d_air_level);
      break;
    case 0xa0:
      dlev_local._7_1_ = on_level(dlev,&dungeon_topology.d_fire_level);
      break;
    case 0xa1:
      dlev_local._7_1_ = on_level(dlev,&dungeon_topology.d_earth_level);
      break;
    case 0xa2:
      dlev_local._7_1_ = on_level(dlev,&dungeon_topology.d_water_level);
      break;
    default:
      goto switchD_0020692c_default;
    }
  }
  else {
switchD_0020692c_default:
    dlev_local._7_1_ = '\0';
  }
  return dlev_local._7_1_;
}

Assistant:

boolean is_home_elemental(const struct d_level *dlev, const struct permonst *ptr)
{
	if (ptr->mlet == S_ELEMENTAL)
	    switch (monsndx(ptr)) {
		case PM_AIR_ELEMENTAL: return Is_airlevel(dlev);
		case PM_FIRE_ELEMENTAL: return Is_firelevel(dlev);
		case PM_EARTH_ELEMENTAL: return Is_earthlevel(dlev);
		case PM_WATER_ELEMENTAL: return Is_waterlevel(dlev);
	    }
	return FALSE;
}